

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

void __thiscall LowererMD::EmitShiftByScalarI2(LowererMD *this,Instr *instr,JnHelperMethod helper)

{
  Opnd *pOVar1;
  Opnd *dst_00;
  MemRefOpnd *pMVar2;
  Instr *instr_00;
  Instr *helperCall;
  MemRefOpnd *dstMemRef;
  MemRefOpnd *srcMemRef;
  Opnd *dst;
  Opnd *src2;
  JnHelperMethod helper_local;
  Instr *instr_local;
  LowererMD *this_local;
  
  pOVar1 = IR::Instr::GetSrc2(instr);
  dst_00 = IR::Instr::GetDst(instr);
  LoadHelperArgument(this,instr,pOVar1);
  pMVar2 = LoadSimdHelperArgument(this,instr,'\0');
  pOVar1 = IR::Instr::GetSrc1(instr);
  Lowerer::InsertMove(&pMVar2->super_Opnd,pOVar1,instr,true);
  pMVar2 = LoadSimdHelperArgument(this,instr,'\x01');
  instr_00 = IR::Instr::New(CALL,this->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  ChangeToHelperCall(this,instr_00,helper,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false
                    );
  Lowerer::InsertMove(dst_00,&pMVar2->super_Opnd,instr,true);
  return;
}

Assistant:

void LowererMD::EmitShiftByScalarI2(IR::Instr *instr, IR::JnHelperMethod helper)
{
    IR::Opnd* src2 = instr->GetSrc2();
    IR::Opnd* dst = instr->GetDst();
    LoadHelperArgument(instr, src2);
    IR::MemRefOpnd* srcMemRef = LoadSimdHelperArgument(instr, 0);
    m_lowerer->InsertMove(srcMemRef, instr->GetSrc1(), instr);
    IR::MemRefOpnd* dstMemRef = LoadSimdHelperArgument(instr, 1);
    IR::Instr * helperCall = IR::Instr::New(Js::OpCode::CALL, this->m_func);
    instr->InsertBefore(helperCall);
    this->ChangeToHelperCall(helperCall, helper);
    m_lowerer->InsertMove(dst, dstMemRef, instr);
}